

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  int *piVar1;
  int iVar2;
  Btree *p;
  Pager *pPager;
  uint uVar3;
  int iVar4;
  sqlite3_vfs *psVar5;
  Pager *pPVar6;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zDbName == (char *)0x0) {
    uVar3 = 0;
LAB_0012f55e:
    p = db->aDb[uVar3].pBt;
    if (p != (Btree *)0x0) {
      if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
        btreeLockCarefully(p);
      }
      pPager = p->pBt->pPager;
      psVar5 = (sqlite3_vfs *)pPager->fd;
      if (op < 0x23) {
        if (op != 7) {
          pPVar6 = pPager;
          if (op != 0x1b) {
            if (op != 0x1c) {
LAB_0012f632:
              iVar2 = (db->busyHandler).nBusy;
              if (*(long *)&psVar5->iVersion == 0) {
                iVar4 = 0xc;
              }
              else {
                iVar4 = (**(code **)(*(long *)&psVar5->iVersion + 0x50))
                                  ((sqlite3_file *)psVar5,op,pArg);
              }
              (db->busyHandler).nBusy = iVar2;
              goto LAB_0012f603;
            }
            pPVar6 = (Pager *)&pPager->jfd;
            if (pPager->pWal != (Wal *)0x0) {
              pPVar6 = (Pager *)&pPager->pWal->pWalFd;
            }
          }
          psVar5 = pPVar6->pVfs;
        }
        *(sqlite3_vfs **)pArg = psVar5;
LAB_0012f601:
        iVar4 = 0;
      }
      else {
        if (op == 0x23) {
          *(u32 *)pArg = pPager->iDataVersion;
          goto LAB_0012f601;
        }
        if (op == 0x26) {
          uVar3 = *pArg;
          iVar4 = sqlite3BtreeGetRequestedReserve(p);
          *(int *)pArg = iVar4;
          iVar4 = 0;
          if (uVar3 < 0x100) {
            iVar4 = 0;
            sqlite3BtreeSetPageSize(p,0,uVar3,0);
          }
        }
        else {
          if (op != 0x2a) goto LAB_0012f632;
          iVar4 = 0;
          if ((p->pBt->inTransaction == '\0') && (pPager->tempFile == '\0')) {
            pager_reset(pPager);
            iVar4 = 0;
          }
        }
      }
LAB_0012f603:
      if (p->sharable != '\0') {
        piVar1 = &p->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(p);
        }
      }
      goto LAB_0012f618;
    }
  }
  else {
    uVar3 = sqlite3FindDbName(db,zDbName);
    if (-1 < (int)uVar3) goto LAB_0012f55e;
  }
  iVar4 = 1;
LAB_0012f618:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_DATA_VERSION ){
      *(unsigned int*)pArg = sqlite3PagerDataVersion(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESERVE_BYTES ){
      int iNew = *(int*)pArg;
      *(int*)pArg = sqlite3BtreeGetRequestedReserve(pBtree);
      if( iNew>=0 && iNew<=255 ){
        sqlite3BtreeSetPageSize(pBtree, 0, iNew, 0);
      }
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESET_CACHE ){
      sqlite3BtreeClearCache(pBtree);
      rc = SQLITE_OK;
    }else{
      int nSave = db->busyHandler.nBusy;
      rc = sqlite3OsFileControl(fd, op, pArg);
      db->busyHandler.nBusy = nSave;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}